

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestCanonicalizePaths::Run(ParserTestCanonicalizePaths *this)

{
  Test *pTVar1;
  int iVar2;
  int iVar3;
  Node *pNVar4;
  StringPiece local_58;
  StringPiece local_48;
  StringPiece local_38;
  StringPiece local_28;
  int local_14;
  ParserTestCanonicalizePaths *pPStack_10;
  int fail_count;
  ParserTestCanonicalizePaths *this_local;
  
  pPStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild ./out.o: cat ./bar/baz/../foo.cc\n");
  iVar2 = local_14;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar3) {
    StringPiece::StringPiece(&local_28,"./out.o");
    pNVar4 = State::LookupNode(&(this->super_ParserTest).state,local_28);
    testing::Test::Check
              (pTVar1,(bool)((pNVar4 != (Node *)0x0 ^ 0xffU) & 1),
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,299,"state.LookupNode(\"./out.o\")");
    pTVar1 = g_current_test;
    StringPiece::StringPiece(&local_38,"out.o");
    pNVar4 = State::LookupNode(&(this->super_ParserTest).state,local_38);
    testing::Test::Check
              (pTVar1,pNVar4 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,300,"state.LookupNode(\"out.o\")");
    pTVar1 = g_current_test;
    StringPiece::StringPiece(&local_48,"./bar/baz/../foo.cc");
    pNVar4 = State::LookupNode(&(this->super_ParserTest).state,local_48);
    testing::Test::Check
              (pTVar1,(bool)((pNVar4 != (Node *)0x0 ^ 0xffU) & 1),
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x12d,"state.LookupNode(\"./bar/baz/../foo.cc\")");
    pTVar1 = g_current_test;
    StringPiece::StringPiece(&local_58,"bar/foo.cc");
    pNVar4 = State::LookupNode(&(this->super_ParserTest).state,local_58);
    testing::Test::Check
              (pTVar1,pNVar4 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x12e,"state.LookupNode(\"bar/foo.cc\")");
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, CanonicalizePaths) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build ./out.o: cat ./bar/baz/../foo.cc\n"));

  EXPECT_FALSE(state.LookupNode("./out.o"));
  EXPECT_TRUE(state.LookupNode("out.o"));
  EXPECT_FALSE(state.LookupNode("./bar/baz/../foo.cc"));
  EXPECT_TRUE(state.LookupNode("bar/foo.cc"));
}